

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyJointLimitConstraint.cpp
# Opt level: O3

void __thiscall
btMultiBodyJointLimitConstraint::finalizeMultiDof(btMultiBodyJointLimitConstraint *this)

{
  int iVar1;
  float *pfVar2;
  ulong uVar3;
  long lVar4;
  
  btMultiBodyConstraint::allocateJacobiansMultiDof(&this->super_btMultiBodyConstraint);
  pfVar2 = (this->super_btMultiBodyConstraint).m_data.m_data;
  uVar3 = (ulong)((((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data
                  [(this->super_btMultiBodyConstraint).m_linkA].m_dofOffset + 6);
  lVar4 = (long)(this->super_btMultiBodyConstraint).m_numRows;
  pfVar2[lVar4 + uVar3] = 1.0;
  iVar1 = (this->super_btMultiBodyConstraint).m_jacSizeBoth;
  pfVar2[(long)(this->super_btMultiBodyConstraint).m_jacSizeA + iVar1 + lVar4 + uVar3] = -1.0;
  (this->super_btMultiBodyConstraint).m_numDofsFinalized = iVar1;
  return;
}

Assistant:

void btMultiBodyJointLimitConstraint::finalizeMultiDof()
{
	// the data.m_jacobians never change, so may as well
    // initialize them here

	allocateJacobiansMultiDof();

	unsigned int offset = 6 + m_bodyA->getLink(m_linkA).m_dofOffset;

	// row 0: the lower bound
	jacobianA(0)[offset] = 1;
	// row 1: the upper bound
	//jacobianA(1)[offset] = -1;
	jacobianB(1)[offset] = -1;

	m_numDofsFinalized = m_jacSizeBoth;
}